

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

size_t __thiscall AutoFile::detail_fread(AutoFile *this,Span<std::byte> dst)

{
  long lVar1;
  FILE *__stream;
  pointer pbVar2;
  size_t key_offset;
  size_t sVar3;
  char *pcVar4;
  byte *__ptr;
  long in_FS_OFFSET;
  Span<std::byte> write;
  Span<const_std::byte> key;
  
  __ptr = dst.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)this->m_file;
  if (__stream == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::read: file handle is nullptr");
  }
  else {
    if ((this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        sVar3 = fread(__ptr,1,dst.m_size,__stream);
        return sVar3;
      }
      goto LAB_00389ff2;
    }
    key_offset = ftell(__stream);
    if (-1 < (long)key_offset) {
      sVar3 = fread(__ptr,1,dst.m_size,(FILE *)this->m_file);
      pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        key.m_size = (long)(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
        write.m_size = sVar3;
        write.m_data = __ptr;
        key.m_data = pbVar2;
        util::Xor(write,key,key_offset);
        return sVar3;
      }
      goto LAB_00389ff2;
    }
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"AutoFile::read: ftell failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_00389ff2:
  __stack_chk_fail();
}

Assistant:

std::size_t AutoFile::detail_fread(Span<std::byte> dst)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::read: file handle is nullptr");
    if (m_xor.empty()) {
        return std::fread(dst.data(), 1, dst.size(), m_file);
    } else {
        const auto init_pos{std::ftell(m_file)};
        if (init_pos < 0) throw std::ios_base::failure("AutoFile::read: ftell failed");
        std::size_t ret{std::fread(dst.data(), 1, dst.size(), m_file)};
        util::Xor(dst.subspan(0, ret), m_xor, init_pos);
        return ret;
    }
}